

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

void __thiscall
PSVIWriterHandlers::processSchemaComponents(PSVIWriterHandlers *this,XSNamespaceItem *namespaceItem)

{
  long lVar1;
  XSTypeDefinition *type;
  XSAttributeDeclaration *attribute;
  XSElementDeclaration *element;
  XSAttributeGroupDefinition *attributeGroup;
  XSModelGroupDefinition *modelGroup;
  XSNotationDeclaration *notation;
  COMPONENT_TYPE CVar2;
  BaseRefVectorOf<xercesc_4_0::XSTypeDefinition> *this_00;
  BaseRefVectorOf<xercesc_4_0::XSAttributeDeclaration> *this_01;
  BaseRefVectorOf<xercesc_4_0::XSElementDeclaration> *this_02;
  BaseRefVectorOf<xercesc_4_0::XSAttributeGroupDefinition> *this_03;
  BaseRefVectorOf<xercesc_4_0::XSModelGroupDefinition> *this_04;
  BaseRefVectorOf<xercesc_4_0::XSNotationDeclaration> *this_05;
  XMLSize_t XVar3;
  
  writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaComponents);
  incIndent(this);
  CVar2 = (COMPONENT_TYPE)namespaceItem;
  lVar1 = xercesc_4_0::XSNamespaceItem::getComponents(CVar2);
  this_00 = *(BaseRefVectorOf<xercesc_4_0::XSTypeDefinition> **)(lVar1 + 0x10);
  if (*(long *)(this_00 + 0x10) != 0) {
    XVar3 = 0;
    do {
      type = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSTypeDefinition>::elementAt(this_00,XVar3);
      processTypeDefinition(this,type);
      XVar3 = XVar3 + 1;
      this_00 = *(BaseRefVectorOf<xercesc_4_0::XSTypeDefinition> **)(lVar1 + 0x10);
    } while (XVar3 < *(ulong *)(this_00 + 0x10));
  }
  lVar1 = xercesc_4_0::XSNamespaceItem::getComponents(CVar2);
  this_01 = *(BaseRefVectorOf<xercesc_4_0::XSAttributeDeclaration> **)(lVar1 + 0x10);
  if (*(long *)(this_01 + 0x10) != 0) {
    XVar3 = 0;
    do {
      attribute = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSAttributeDeclaration>::elementAt
                            (this_01,XVar3);
      processAttributeDeclaration(this,attribute);
      XVar3 = XVar3 + 1;
      this_01 = *(BaseRefVectorOf<xercesc_4_0::XSAttributeDeclaration> **)(lVar1 + 0x10);
    } while (XVar3 < *(ulong *)(this_01 + 0x10));
  }
  lVar1 = xercesc_4_0::XSNamespaceItem::getComponents(CVar2);
  this_02 = *(BaseRefVectorOf<xercesc_4_0::XSElementDeclaration> **)(lVar1 + 0x10);
  if (*(long *)(this_02 + 0x10) != 0) {
    XVar3 = 0;
    do {
      element = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSElementDeclaration>::elementAt
                          (this_02,XVar3);
      processElementDeclaration(this,element);
      XVar3 = XVar3 + 1;
      this_02 = *(BaseRefVectorOf<xercesc_4_0::XSElementDeclaration> **)(lVar1 + 0x10);
    } while (XVar3 < *(ulong *)(this_02 + 0x10));
  }
  lVar1 = xercesc_4_0::XSNamespaceItem::getComponents(CVar2);
  this_03 = *(BaseRefVectorOf<xercesc_4_0::XSAttributeGroupDefinition> **)(lVar1 + 0x10);
  if (*(long *)(this_03 + 0x10) != 0) {
    XVar3 = 0;
    do {
      attributeGroup =
           xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSAttributeGroupDefinition>::elementAt
                     (this_03,XVar3);
      processAttributeGroupDefinition(this,attributeGroup);
      XVar3 = XVar3 + 1;
      this_03 = *(BaseRefVectorOf<xercesc_4_0::XSAttributeGroupDefinition> **)(lVar1 + 0x10);
    } while (XVar3 < *(ulong *)(this_03 + 0x10));
  }
  lVar1 = xercesc_4_0::XSNamespaceItem::getComponents(CVar2);
  this_04 = *(BaseRefVectorOf<xercesc_4_0::XSModelGroupDefinition> **)(lVar1 + 0x10);
  if (*(long *)(this_04 + 0x10) != 0) {
    XVar3 = 0;
    do {
      modelGroup = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSModelGroupDefinition>::elementAt
                             (this_04,XVar3);
      processModelGroupDefinition(this,modelGroup);
      XVar3 = XVar3 + 1;
      this_04 = *(BaseRefVectorOf<xercesc_4_0::XSModelGroupDefinition> **)(lVar1 + 0x10);
    } while (XVar3 < *(ulong *)(this_04 + 0x10));
  }
  lVar1 = xercesc_4_0::XSNamespaceItem::getComponents(CVar2);
  this_05 = *(BaseRefVectorOf<xercesc_4_0::XSNotationDeclaration> **)(lVar1 + 0x10);
  if (*(long *)(this_05 + 0x10) != 0) {
    XVar3 = 0;
    do {
      notation = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSNotationDeclaration>::elementAt
                           (this_05,XVar3);
      processNotationDeclaration(this,notation);
      XVar3 = XVar3 + 1;
      this_05 = *(BaseRefVectorOf<xercesc_4_0::XSNotationDeclaration> **)(lVar1 + 0x10);
    } while (XVar3 < *(ulong *)(this_05 + 0x10));
  }
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaComponents);
  return;
}

Assistant:

void PSVIWriterHandlers::processSchemaComponents(XSNamespaceItem* namespaceItem) {
	sendIndentedElement(PSVIUni::fgSchemaComponents);
	XSNamedMap<XSTypeDefinition>* types = (XSNamedMap<XSTypeDefinition>*)(namespaceItem->getComponents(XSConstants::TYPE_DEFINITION));
	for (XMLSize_t typeCount = 0; typeCount < types->getLength(); typeCount++) {
		processTypeDefinition(types->item(typeCount));
	}
	XSNamedMap<XSAttributeDeclaration>* attributes = (XSNamedMap<XSAttributeDeclaration>*)namespaceItem->getComponents(XSConstants::ATTRIBUTE_DECLARATION);
	for (XMLSize_t attrCount = 0; attrCount < attributes->getLength(); attrCount++) {
		processAttributeDeclaration(attributes->item(attrCount));
	}
	XSNamedMap<XSElementDeclaration>* elements = (XSNamedMap<XSElementDeclaration>*)namespaceItem->getComponents(XSConstants::ELEMENT_DECLARATION);
	for (XMLSize_t elemCount = 0; elemCount < elements->getLength(); elemCount++) {
		processElementDeclaration(elements->item(elemCount));
	}
	XSNamedMap<XSAttributeGroupDefinition>* attrGroups = (XSNamedMap<XSAttributeGroupDefinition>*)namespaceItem->getComponents(XSConstants::ATTRIBUTE_GROUP_DEFINITION);
	for (XMLSize_t attrGroupCount = 0; attrGroupCount < attrGroups->getLength(); attrGroupCount++) {
		processAttributeGroupDefinition(attrGroups->item(attrGroupCount));
	}
	XSNamedMap<XSModelGroupDefinition>* modelGroups = (XSNamedMap<XSModelGroupDefinition>*)namespaceItem->getComponents(XSConstants::MODEL_GROUP_DEFINITION);
	for (XMLSize_t modelGroupCount = 0; modelGroupCount < modelGroups->getLength(); modelGroupCount++) {
		processModelGroupDefinition(modelGroups->item(modelGroupCount));
	}
	XSNamedMap<XSNotationDeclaration>* notations = (XSNamedMap<XSNotationDeclaration>*)namespaceItem->getComponents(XSConstants::NOTATION_DECLARATION);
	for (XMLSize_t notationCount = 0; notationCount < notations->getLength(); notationCount++) {
		processNotationDeclaration(notations->item(notationCount));
	}
	sendUnindentedElement(PSVIUni::fgSchemaComponents);
}